

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t COVER_buildDictionary
                 (COVER_ctx_t *ctx,U32 *freqs,COVER_map_t *activeDmers,void *dictBuffer,
                 size_t dictBufferCapacity,ZDICT_cover_params_t parameters)

{
  U32 UVar1;
  COVER_map_pair_t *pCVar2;
  bool bVar3;
  U32 UVar4;
  uint uVar5;
  uint uVar6;
  COVER_epoch_info_t CVar7;
  ulong uVar8;
  U32 *pUVar9;
  clock_t cVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  U32 newEnd;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  size_t sVar22;
  uint local_b0;
  COVER_map_pair_t *local_a8;
  ulong uVar10;
  
  CVar7 = COVER_computeEpochs((U32)dictBufferCapacity,(U32)ctx->suffixSize,parameters.k,4);
  uVar8 = (ulong)CVar7 >> 3 & 0x1fffffff;
  uVar13 = 100;
  if ((uint)uVar8 < 100) {
    uVar13 = uVar8;
  }
  uVar8 = 10;
  if (0x4f < CVar7.num) {
    uVar8 = uVar13;
  }
  if (1 < g_displayLevel) {
    fprintf(_stderr,"Breaking content into %u epochs of size %u\n",(ulong)CVar7 & 0xffffffff);
    fflush(_stderr);
  }
  uVar14 = 0;
  uVar13 = 0;
  sVar22 = dictBufferCapacity;
  while (sVar22 != 0) {
    uVar19 = uVar14 * ((ulong)CVar7 >> 0x20);
    iVar18 = (int)uVar19;
    memset(activeDmers->data,0xff,(ulong)activeDmers->size << 3);
    uVar21 = uVar19 & 0xffffffff;
    uVar20 = 0;
    local_b0 = 0;
    uVar12 = 0;
    uVar17 = 0;
    while (uVar15 = uVar12, uVar6 = local_b0, uVar21 < CVar7.size + iVar18) {
      uVar15 = ctx->dmerAt[uVar21];
      pUVar9 = COVER_map_at(activeDmers,uVar15);
      if (*pUVar9 == 0) {
        uVar20 = uVar20 + freqs[uVar15];
      }
      uVar21 = uVar21 + 1;
      *pUVar9 = *pUVar9 + 1;
      if ((uint)uVar21 - (int)uVar19 == (parameters.k - parameters.d) + 2) {
        uVar15 = ctx->dmerAt[uVar19 & 0xffffffff];
        pUVar9 = COVER_map_at(activeDmers,uVar15);
        uVar19 = (ulong)((int)uVar19 + 1);
        *pUVar9 = *pUVar9 - 1;
        if (*pUVar9 == 0) {
          UVar4 = COVER_map_index(activeDmers,uVar15);
          uVar10 = (ulong)UVar4;
          pCVar2 = activeDmers->data;
          if (pCVar2[UVar4].value != 0xffffffff) {
            uVar6 = activeDmers->sizeMask;
            local_a8 = pCVar2 + UVar4;
            do {
              uVar16 = 1;
              while( true ) {
                uVar5 = (int)uVar10 + 1U & uVar6;
                uVar10 = (ulong)uVar5;
                UVar4 = pCVar2[uVar10].value;
                if (UVar4 == 0xffffffff) {
                  local_a8->value = 0xffffffff;
                  goto LAB_00177bd3;
                }
                UVar1 = pCVar2[uVar10].key;
                if (uVar16 <= (uVar5 - (UVar1 * -0x61c8864f >> (-(char)activeDmers->sizeLog & 0x1fU)
                                       ) & uVar6)) break;
                uVar16 = uVar16 + 1;
              }
              local_a8->key = UVar1;
              local_a8->value = UVar4;
              local_a8 = pCVar2 + uVar10;
            } while( true );
          }
LAB_00177bd3:
          uVar20 = uVar20 - freqs[uVar15];
        }
      }
      uVar15 = uVar17;
      if (uVar17 < uVar20) {
        local_b0 = (uint)uVar21;
        uVar15 = uVar20;
      }
      bVar3 = uVar17 < uVar20;
      uVar17 = uVar15;
      if (bVar3) {
        uVar12 = (uint)uVar19;
      }
    }
    while (uVar19 = (ulong)uVar12, uVar20 = uVar6, local_b0 != uVar12) {
      if (uVar12 <= uVar6) {
        uVar20 = uVar12;
      }
      uVar12 = uVar12 + 1;
      if (freqs[ctx->dmerAt[uVar19]] != 0) {
        uVar15 = uVar12;
        uVar6 = uVar20;
      }
    }
    for (; uVar15 != uVar20; uVar20 = uVar20 + 1) {
      freqs[ctx->dmerAt[uVar20]] = 0;
    }
    if (uVar17 == 0) {
      uVar13 = uVar13 + 1;
      if (uVar8 <= uVar13) break;
    }
    else {
      uVar13 = (ulong)(uVar15 + parameters.d + ~uVar6);
      if (sVar22 < uVar13) {
        uVar13 = sVar22;
      }
      if (uVar13 < parameters.d) break;
      sVar22 = sVar22 - uVar13;
      memcpy((void *)((long)dictBuffer + sVar22),ctx->samples + uVar6,uVar13);
      if ((1 < g_displayLevel) &&
         ((cVar11 = clock(), 150000 < cVar11 - g_time || (3 < g_displayLevel)))) {
        g_time = clock();
        fprintf(_stderr,"\r%u%%       ",
                ((dictBufferCapacity - sVar22) * 100) / dictBufferCapacity & 0xffffffff);
        fflush(_stderr);
      }
      uVar13 = 0;
    }
    uVar14 = (uVar14 + 1) % ((ulong)CVar7 & 0xffffffff);
  }
  if (1 < g_displayLevel) {
    fprintf(_stderr,"\r%79s\r","");
    fflush(_stderr);
  }
  return sVar22;
}

Assistant:

static size_t COVER_buildDictionary(const COVER_ctx_t *ctx, U32 *freqs,
                                    COVER_map_t *activeDmers, void *dictBuffer,
                                    size_t dictBufferCapacity,
                                    ZDICT_cover_params_t parameters) {
  BYTE *const dict = (BYTE *)dictBuffer;
  size_t tail = dictBufferCapacity;
  /* Divide the data into epochs. We will select one segment from each epoch. */
  const COVER_epoch_info_t epochs = COVER_computeEpochs(
      (U32)dictBufferCapacity, (U32)ctx->suffixSize, parameters.k, 4);
  const size_t maxZeroScoreRun = MAX(10, MIN(100, epochs.num >> 3));
  size_t zeroScoreRun = 0;
  size_t epoch;
  DISPLAYLEVEL(2, "Breaking content into %u epochs of size %u\n",
                (U32)epochs.num, (U32)epochs.size);
  /* Loop through the epochs until there are no more segments or the dictionary
   * is full.
   */
  for (epoch = 0; tail > 0; epoch = (epoch + 1) % epochs.num) {
    const U32 epochBegin = (U32)(epoch * epochs.size);
    const U32 epochEnd = epochBegin + epochs.size;
    size_t segmentSize;
    /* Select a segment */
    COVER_segment_t segment = COVER_selectSegment(
        ctx, freqs, activeDmers, epochBegin, epochEnd, parameters);
    /* If the segment covers no dmers, then we are out of content.
     * There may be new content in other epochs, for continue for some time.
     */
    if (segment.score == 0) {
      if (++zeroScoreRun >= maxZeroScoreRun) {
          break;
      }
      continue;
    }
    zeroScoreRun = 0;
    /* Trim the segment if necessary and if it is too small then we are done */
    segmentSize = MIN(segment.end - segment.begin + parameters.d - 1, tail);
    if (segmentSize < parameters.d) {
      break;
    }
    /* We fill the dictionary from the back to allow the best segments to be
     * referenced with the smallest offsets.
     */
    tail -= segmentSize;
    memcpy(dict + tail, ctx->samples + segment.begin, segmentSize);
    DISPLAYUPDATE(
        2, "\r%u%%       ",
        (unsigned)(((dictBufferCapacity - tail) * 100) / dictBufferCapacity));
  }
  DISPLAYLEVEL(2, "\r%79s\r", "");
  return tail;
}